

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Snake::to_corruct_direction(Snake *this,Direction *direction)

{
  Direction *direction_local;
  Snake *this_local;
  
  if ((*direction == LEFT) && (this->last_move == RIGHT)) {
    *direction = RIGHT;
  }
  else if ((*direction == RIGHT) && (this->last_move == LEFT)) {
    *direction = LEFT;
  }
  else if ((*direction == UP) && (this->last_move == DOWN)) {
    *direction = DOWN;
  }
  else if ((*direction == DOWN) && (this->last_move == UP)) {
    *direction = UP;
  }
  else {
    this->last_move = *direction;
  }
  return;
}

Assistant:

void Snake::to_corruct_direction(Direction& direction)
{
    // RIGHT
    if(direction == LEFT and last_move == RIGHT)
    {
        direction = RIGHT;
        return;
    }

    // LEFT
    if(direction == RIGHT and last_move == LEFT)
    {
        direction = LEFT;
        return;
    }

    // DOWN
    if(direction == UP and last_move == DOWN)
    {
        direction = DOWN;
        return;
    }

    // UP
    if(direction == DOWN and last_move == UP)
    {
        direction = UP;
        return;
    }
    last_move = direction;
}